

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void makeliteral_cc(strbuf *b,termchar *c,unsigned_long *state)

{
  wchar_t wVar1;
  unsigned_long zstate;
  termchar z;
  unsigned_long local_40;
  termchar local_38;
  
  wVar1 = c->cc_next;
  if (wVar1 != L'\0') {
    do {
      if (c[wVar1].chr == 0) {
        __assert_fail("c->chr != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/terminal.c"
                      ,0x2a6,"void makeliteral_cc(strbuf *, termchar *, unsigned long *)");
      }
      c = c + wVar1;
      local_40 = 0;
      makeliteral_chr(b,c,&local_40);
      wVar1 = c->cc_next;
    } while (wVar1 != L'\0');
  }
  local_38.chr = 0;
  local_40 = 0;
  makeliteral_chr(b,&local_38,&local_40);
  return;
}

Assistant:

static void makeliteral_cc(strbuf *b, termchar *c, unsigned long *state)
{
    /*
     * For combining characters, I just encode a bunch of ordinary
     * chars using makeliteral_chr, and terminate with a \0
     * character (which I know won't come up as a combining char
     * itself).
     *
     * I don't use the stateful encoding in makeliteral_chr.
     */
    unsigned long zstate;
    termchar z;

    while (c->cc_next) {
        c += c->cc_next;

        assert(c->chr != 0);

        zstate = 0;
        makeliteral_chr(b, c, &zstate);
    }

    z.chr = 0;
    zstate = 0;
    makeliteral_chr(b, &z, &zstate);
}